

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

bool __thiscall QPDF::findEndstream(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  InputSource *this_00;
  int iVar2;
  qpdf_offset_t qVar3;
  bool bVar4;
  bool bVar5;
  Token t;
  long *local_c8;
  size_t local_c0;
  long local_b8 [2];
  long *local_a8;
  size_t local_a0;
  long local_98 [2];
  Token local_88;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  ::qpdf::Tokenizer::readToken
            (&local_88,&(_Var1._M_head_impl)->tokenizer,
             ((_Var1._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &(_Var1._M_head_impl)->last_object_description,true,0x14);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"endobj","");
  if ((local_88.type == tt_word) && (local_88.value._M_string_length == local_c0)) {
    if (local_88.value._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp(local_88.value._M_dataplus._M_p,local_c8,local_88.value._M_string_length);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  bVar5 = true;
  if (!bVar4) {
    local_a8 = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"endstream","");
    if ((local_88.type == tt_word) && (local_88.value._M_string_length == local_a0)) {
      if (local_88.value._M_string_length != 0) {
        iVar2 = bcmp(local_88.value._M_dataplus._M_p,local_a8,local_88.value._M_string_length);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
  }
  if ((!bVar4) && (local_a8 != local_98)) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (bVar5 != false) {
    this_00 = (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar3 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar3,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.error_message._M_dataplus._M_p != &local_88.error_message.field_2) {
    operator_delete(local_88.error_message._M_dataplus._M_p,
                    local_88.error_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.raw_value._M_dataplus._M_p != &local_88.raw_value.field_2) {
    operator_delete(local_88.raw_value._M_dataplus._M_p,
                    local_88.raw_value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.value._M_dataplus._M_p != &local_88.value.field_2) {
    operator_delete(local_88.value._M_dataplus._M_p,local_88.value.field_2._M_allocated_capacity + 1
                   );
  }
  return bVar5;
}

Assistant:

bool
QPDF::findEndstream()
{
    // Find endstream or endobj. Position the input at that token.
    auto t = readToken(*m->file, 20);
    if (t.isWord("endobj") || t.isWord("endstream")) {
        m->file->seek(m->file->getLastOffset(), SEEK_SET);
        return true;
    }
    return false;
}